

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextVkImpl::CommitDescriptorSets
          (DeviceContextVkImpl *this,ResourceBindInfo *BindInfo,Uint32 CommitSRBMask)

{
  array<VkDescriptorSet_T_*,_16UL> *pDescriptorSets;
  SRBMaskType *pSVar1;
  DescriptorSetInfo *pDVar2;
  byte bVar3;
  uint32_t firstSet;
  ShaderResourceCacheVk *this_00;
  Uint32 UVar4;
  uint uVar5;
  Uint32 UVar6;
  VkDescriptorSet_T *pVVar7;
  char (*in_RCX) [57];
  ResourceBindInfo *Args_1;
  ulong uVar8;
  VkPipelineBindPoint pipelineBindPoint;
  char (*in_R8) [50];
  uint descriptorSetCount;
  uint uVar9;
  uint local_8c;
  string msg;
  ResourceBindInfo *local_68;
  
  if (CommitSRBMask == 0) {
    FormatString<char[65]>
              (&msg,(char (*) [65])
                    "This method should not be called when there is nothing to commit");
    in_RCX = (char (*) [57])0x1a4;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"CommitDescriptorSets",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x1a4);
    std::__cxx11::string::~string((string *)&msg);
  }
  uVar8 = 0x20;
  if (CommitSRBMask != 0) {
    uVar9 = 0;
    if (CommitSRBMask != 0) {
      for (; (CommitSRBMask >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
      }
    }
    uVar8 = (ulong)uVar9;
  }
  uVar9 = 0x1f;
  if (CommitSRBMask != 0) {
    for (; CommitSRBMask >> uVar9 == 0; uVar9 = uVar9 - 1) {
    }
  }
  if (CommitSRBMask == 0) {
    uVar9 = 0x20;
  }
  UVar4 = PipelineStateBase<Diligent::EngineVkImplTraits>::GetResourceSignatureCount
                    (&((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                       super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pPipelineState.
                      m_pObject)->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
  if (UVar4 <= uVar9) {
    FormatString<char[26],char[57]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"LastSign < m_pPipelineState->GetResourceSignatureCount()",in_RCX);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"CommitDescriptorSets",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x1a8);
    std::__cxx11::string::~string((string *)&msg);
  }
  firstSet = *(uint32_t *)
              ((long)(&(BindInfo->SetInfo)._M_elems[0].vkSets + 1) + (ulong)(uint)((int)uVar8 << 5))
  ;
  pDescriptorSets = &this->m_DescriptorSets;
  descriptorSetCount = 0;
  local_68 = (ResourceBindInfo *)0x0;
  Args_1 = BindInfo;
  do {
    local_8c = (uint)uVar8;
    UVar4 = (Uint32)local_68;
    if (uVar9 < local_8c) {
      pipelineBindPoint = (this->m_State).vkPipelineBindPoint;
      if (pipelineBindPoint == VK_PIPELINE_BIND_POINT_MAX_ENUM) {
        FormatString<char[26],char[63]>
                  (&msg,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"m_State.vkPipelineBindPoint != VK_PIPELINE_BIND_POINT_MAX_ENUM",
                   (char (*) [63])Args_1);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"CommitDescriptorSets",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x1dd);
        std::__cxx11::string::~string((string *)&msg);
        pipelineBindPoint = (this->m_State).vkPipelineBindPoint;
      }
      VulkanUtilities::VulkanCommandBuffer::BindDescriptorSets
                (&this->m_CommandBuffer,pipelineBindPoint,BindInfo->vkPipelineLayout,firstSet,
                 descriptorSetCount,pDescriptorSets->_M_elems,UVar4,
                 (this->m_DynamicBufferOffsets).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start);
      pSVar1 = &(BindInfo->super_CommittedShaderResources).StaleSRBMask;
      *pSVar1 = *pSVar1 & ~(BindInfo->super_CommittedShaderResources).ActiveSRBMask;
      return;
    }
    pDVar2 = (BindInfo->SetInfo)._M_elems + uVar8;
    pVVar7 = (BindInfo->SetInfo)._M_elems[uVar8].vkSets._M_elems[0];
    if (pVVar7 == (VkDescriptorSet_T *)0x0) {
      if ((CommitSRBMask >> (local_8c & 0x1f) & 1) == 0) {
        pVVar7 = (VkDescriptorSet_T *)0x0;
      }
      else {
        FormatString<char[131]>
                  (&msg,(char (*) [131])
                        "At least one descriptor set in the stale SRB must not be NULL. Empty SRBs should not be marked as stale by CommitShaderResources()"
                  );
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"CommitDescriptorSets",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x1b2);
        std::__cxx11::string::~string((string *)&msg);
        pVVar7 = (pDVar2->vkSets)._M_elems[0];
      }
    }
    bVar3 = (BindInfo->super_CommittedShaderResources).ActiveSRBMask;
    Args_1 = (ResourceBindInfo *)(ulong)bVar3;
    if ((bVar3 >> (local_8c & 0x1f) & 1) == 0) {
      if (pVVar7 != (VkDescriptorSet_T *)0x0) {
        FormatString<char[48]>
                  (&msg,(char (*) [48])"Descriptor sets must be null for inactive slots");
        Args_1 = (ResourceBindInfo *)0x1b4;
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"CommitDescriptorSets",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x1b4);
        std::__cxx11::string::~string((string *)&msg);
        pVVar7 = (pDVar2->vkSets)._M_elems[0];
        goto LAB_001d22a7;
      }
LAB_001d2386:
      if ((pDVar2->vkSets)._M_elems[1] != (VkDescriptorSet_T *)0x0) {
        FormatString<char[26],char[36]>
                  (&msg,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"SetInfo.vkSets[1] == VK_NULL_HANDLE",(char (*) [36])Args_1);
        Args_1 = (ResourceBindInfo *)0x1b7;
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"CommitDescriptorSets",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x1b7);
        std::__cxx11::string::~string((string *)&msg);
      }
    }
    else {
LAB_001d22a7:
      if (pVVar7 == (VkDescriptorSet_T *)0x0) goto LAB_001d2386;
      uVar5 = pDVar2->BaseInd;
      if (uVar5 < firstSet + descriptorSetCount) {
        FormatString<char[26],char[50]>
                  (&msg,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"SetInfo.BaseInd >= FirstSetToBind + TotalSetCount",
                   (char (*) [50])(ulong)(firstSet + descriptorSetCount));
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"CommitDescriptorSets",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x1bb);
        std::__cxx11::string::~string((string *)&msg);
        uVar5 = pDVar2->BaseInd;
      }
      for (; firstSet + descriptorSetCount < uVar5; descriptorSetCount = descriptorSetCount + 1) {
        pDescriptorSets->_M_elems[descriptorSetCount] = (VkDescriptorSet_T *)0x0;
      }
      this_00 = (BindInfo->super_CommittedShaderResources).ResourceCaches._M_elems[local_8c];
      if (this_00 == (ShaderResourceCacheVk *)0x0) {
        FormatString<char[33],unsigned_int,char[50]>
                  (&msg,(Diligent *)"Resource cache at binding index ",(char (*) [33])&local_8c,
                   (uint *)" is null, but corresponding descriptor set is not",in_R8);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"CommitDescriptorSets",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x1c0);
        std::__cxx11::string::~string((string *)&msg);
      }
      pDescriptorSets->_M_elems[descriptorSetCount] = (pDVar2->vkSets)._M_elems[0];
      Args_1 = (ResourceBindInfo *)(pDVar2->vkSets)._M_elems[1];
      uVar5 = descriptorSetCount + 1;
      if (Args_1 != (ResourceBindInfo *)0x0) {
        pDescriptorSets->_M_elems[descriptorSetCount + 1] = (VkDescriptorSet_T *)Args_1;
        uVar5 = descriptorSetCount + 2;
      }
      descriptorSetCount = uVar5;
      if ((ulong)pDVar2->DynamicOffsetCount != 0) {
        if ((char *)((long)(this->m_DynamicBufferOffsets).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(this->m_DynamicBufferOffsets).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start >> 2) <
            (char *)((long)(local_68->super_CommittedShaderResources).ResourceCaches._M_elems +
                    (ulong)pDVar2->DynamicOffsetCount)) {
          FormatString<char[87]>
                    (&msg,(char (*) [87])
                          "m_DynamicBufferOffsets must\'ve been resized by SetPipelineState() to have enough space"
                    );
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"CommitDescriptorSets",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                     ,0x1c9);
          std::__cxx11::string::~string((string *)&msg);
        }
        UVar6 = ShaderResourceCacheVk::GetDynamicBufferOffsets
                          (this_00,this,&this->m_DynamicBufferOffsets,UVar4);
        if (UVar6 != pDVar2->DynamicOffsetCount) {
          FormatString<char[26],char[48]>
                    (&msg,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])"NumOffsetsWritten == SetInfo.DynamicOffsetCount",
                     (char (*) [48])local_68);
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"CommitDescriptorSets",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                     ,0x1cc);
          std::__cxx11::string::~string((string *)&msg);
          UVar6 = pDVar2->DynamicOffsetCount;
        }
        Args_1 = (ResourceBindInfo *)(ulong)(UVar4 + UVar6);
        local_68 = Args_1;
      }
      pDVar2->LastBoundBaseInd = pDVar2->BaseInd;
    }
    uVar8 = (ulong)(local_8c + 1);
  } while( true );
}

Assistant:

void DeviceContextVkImpl::CommitDescriptorSets(ResourceBindInfo& BindInfo, Uint32 CommitSRBMask)
{
    VERIFY(CommitSRBMask != 0, "This method should not be called when there is nothing to commit");

    const Uint32 FirstSign = PlatformMisc::GetLSB(CommitSRBMask);
    const Uint32 LastSign  = PlatformMisc::GetMSB(CommitSRBMask);
    VERIFY_EXPR(LastSign < m_pPipelineState->GetResourceSignatureCount());

    // Bind all descriptor sets in a single BindDescriptorSets call
    uint32_t     DynamicOffsetCount = 0;
    uint32_t     TotalSetCount      = 0;
    const Uint32 FirstSetToBind     = BindInfo.SetInfo[FirstSign].BaseInd;
    for (Uint32 sign = FirstSign; sign <= LastSign; ++sign)
    {
        ResourceBindInfo::DescriptorSetInfo& SetInfo = BindInfo.SetInfo[sign];
        VERIFY(SetInfo.vkSets[0] != VK_NULL_HANDLE || (CommitSRBMask & (1u << sign)) == 0,
               "At least one descriptor set in the stale SRB must not be NULL. Empty SRBs should not be marked as stale by CommitShaderResources()");

        VERIFY((BindInfo.ActiveSRBMask & (1u << sign)) != 0 || SetInfo.vkSets[0] == VK_NULL_HANDLE, "Descriptor sets must be null for inactive slots");
        if (SetInfo.vkSets[0] == VK_NULL_HANDLE)
        {
            VERIFY_EXPR(SetInfo.vkSets[1] == VK_NULL_HANDLE);
            continue;
        }

        VERIFY_EXPR(SetInfo.BaseInd >= FirstSetToBind + TotalSetCount);
        while (FirstSetToBind + TotalSetCount < SetInfo.BaseInd)
            m_DescriptorSets[TotalSetCount++] = VK_NULL_HANDLE;

        const ShaderResourceCacheVk* pResourceCache = BindInfo.ResourceCaches[sign];
        DEV_CHECK_ERR(pResourceCache != nullptr, "Resource cache at binding index ", sign, " is null, but corresponding descriptor set is not");

        m_DescriptorSets[TotalSetCount++] = SetInfo.vkSets[0];
        if (SetInfo.vkSets[1] != VK_NULL_HANDLE)
            m_DescriptorSets[TotalSetCount++] = SetInfo.vkSets[1];

        if (SetInfo.DynamicOffsetCount > 0)
        {
            VERIFY(m_DynamicBufferOffsets.size() >= size_t{DynamicOffsetCount} + size_t{SetInfo.DynamicOffsetCount},
                   "m_DynamicBufferOffsets must've been resized by SetPipelineState() to have enough space");

            Uint32 NumOffsetsWritten = pResourceCache->GetDynamicBufferOffsets(this, m_DynamicBufferOffsets, DynamicOffsetCount);
            VERIFY_EXPR(NumOffsetsWritten == SetInfo.DynamicOffsetCount);
            DynamicOffsetCount += SetInfo.DynamicOffsetCount;
        }

#ifdef DILIGENT_DEVELOPMENT
        SetInfo.LastBoundBaseInd = SetInfo.BaseInd;
#endif
    }

    // Note that there is one global dynamic buffer from which all dynamic resources are suballocated in Vulkan back-end,
    // and this buffer is not resizable, so the buffer handle can never change.

    // vkCmdBindDescriptorSets causes the sets numbered [firstSet .. firstSet+descriptorSetCount-1] to use the
    // bindings stored in pDescriptorSets[0 .. descriptorSetCount-1] for subsequent rendering commands
    // (either compute or graphics, according to the pipelineBindPoint). Any bindings that were previously
    // applied via these sets are no longer valid.
    // https://www.khronos.org/registry/vulkan/specs/1.3-extensions/man/html/vkCmdBindDescriptorSets.html
    VERIFY_EXPR(m_State.vkPipelineBindPoint != VK_PIPELINE_BIND_POINT_MAX_ENUM);
    m_CommandBuffer.BindDescriptorSets(m_State.vkPipelineBindPoint, BindInfo.vkPipelineLayout, FirstSetToBind, TotalSetCount,
                                       m_DescriptorSets.data(), DynamicOffsetCount, m_DynamicBufferOffsets.data());

    BindInfo.StaleSRBMask &= ~BindInfo.ActiveSRBMask;
}